

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DefUseManager::EraseUseRecordsOfOperandIds
          (DefUseManager *this,Instruction *inst)

{
  undefined4 *puVar1;
  iterator __it;
  iterator iVar2;
  undefined4 *puVar3;
  pair<std::_Rb_tree_iterator<spvtools::opt::analysis::UserEntry>,_std::_Rb_tree_iterator<spvtools::opt::analysis::UserEntry>_>
  pVar4;
  key_type local_48;
  Instruction *local_38;
  
  local_38 = inst;
  __it = std::
         _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->inst_to_used_ids_)._M_h,&local_38);
  if (__it.
      super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    puVar3 = *(undefined4 **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x10);
    puVar1 = *(undefined4 **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x18);
    if (puVar3 != puVar1) {
      do {
        local_48.def = (Instruction *)CONCAT44(local_48.def._4_4_,*puVar3);
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,(key_type_conflict *)&local_48);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_48.def = (Instruction *)0x0;
        }
        else {
          local_48.def = *(Instruction **)
                          ((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                 ._M_cur + 0x10);
        }
        local_48.user = local_38;
        pVar4 = std::
                _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
                ::equal_range(&(this->id_to_users_)._M_t,&local_48);
        std::
        _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
        ::_M_erase_aux(&(this->id_to_users_)._M_t,(_Base_ptr)pVar4.first._M_node,
                       (_Base_ptr)pVar4.second._M_node);
        puVar3 = puVar3 + 1;
      } while (puVar3 != puVar1);
    }
    std::
    _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->inst_to_used_ids_)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
            ._M_cur);
  }
  return;
}

Assistant:

void DefUseManager::EraseUseRecordsOfOperandIds(const Instruction* inst) {
  // Go through all ids used by this instruction, remove this instruction's
  // uses of them.
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    for (auto use_id : iter->second) {
      id_to_users_.erase(
          UserEntry{GetDef(use_id), const_cast<Instruction*>(inst)});
    }
    inst_to_used_ids_.erase(iter);
  }
}